

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

void __thiscall
miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>
          (Node<unsigned_int> *this,KeyParser *ctx)

{
  size_t *psVar1;
  _Rb_tree_node_base *p_Var2;
  Node<CPubKey> *pNVar3;
  pointer psVar4;
  pointer pCVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Comp CVar8;
  _Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false> *p_Var9;
  pointer __first;
  pointer __last;
  bool bVar10;
  bool bVar11;
  optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *__begin0;
  pointer p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  ulong uVar16;
  pointer poVar17;
  pointer poVar18;
  undefined8 uVar19;
  bool *in_RCX;
  _Rb_tree_node_base *__tmp;
  pointer poVar20;
  _Tp_alloc_type *__alloc;
  _Base_ptr p_Var21;
  _Rb_tree_node_base *p_Var22;
  allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
  *extraout_RDX;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  ulong uVar23;
  uchar *b;
  ulong uVar24;
  _Self __tmp_2;
  optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *__first_00;
  unsigned_long __tmp_1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  ulong local_178;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
  local_120;
  _Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> local_f0;
  _Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
  local_b8;
  _Storage<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false>
  local_78;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._0_4_ = 0;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
              *)&stack,this,(int *)&local_78,in_RCX);
  poVar18 = (pointer)0x0;
LAB_00acbb1b:
  while( true ) {
    if (stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_start) break;
    pNVar3 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].node;
    uVar16 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].expanded;
    psVar4 = (pNVar3->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar24 = (long)(pNVar3->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4;
    if (uVar24 <= uVar16) {
      if ((ulong)(((long)poVar18 -
                  (long)results.
                        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) < uVar24) {
        __assert_fail("results.size() >= node.subs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0x273,
                      "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      poVar20 = (pointer)((long)results.
                                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         uVar24 * -0x38 +
                         ((long)poVar18 -
                         (long)results.
                               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      poVar17 = poVar20;
      if (((pNVar3->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == false) ||
         ((pNVar3->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_payload._M_value != true)) {
LAB_00acbbb1:
        if (poVar17 != poVar18) goto code_r0x00acbbb6;
        b = ((pNVar3->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_start)->vch;
        pCVar5 = (pNVar3->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_178 = (long)pCVar5 - (long)b >> 2;
        local_120._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_120._M_impl.super__Rb_tree_header._M_header;
        local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr = (Comp)(Comp)ctx;
        local_120._M_impl.super__Rb_tree_header._M_header._M_right =
             local_120._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; (pointer)b != pCVar5; b = b + 4) {
          if ((local_120._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (bVar10 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                 ((Comp *)&local_120,
                                  &local_120._M_impl.super__Rb_tree_header._M_header._M_right[1].
                                   _M_color,(uint *)b), !bVar10)) {
            pVar25 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                     ::_M_get_insert_unique_pos(&local_120,(key_type_conflict3 *)b);
            p_Var21 = pVar25.second;
            bVar10 = pVar25.first != (_Rb_tree_node_base *)0x0;
          }
          else {
            bVar10 = false;
            p_Var21 = local_120._M_impl.super__Rb_tree_header._M_header._M_right;
          }
          if (p_Var21 != (_Base_ptr)0x0) {
            bVar11 = true;
            if (!bVar10 && &local_120._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var21) {
              bVar11 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                 ((Comp *)&local_120,(uint *)b,&p_Var21[1]._M_color);
            }
            p_Var12 = std::allocator_traits<std::allocator<std::_Rb_tree_node<unsigned_int>_>_>::
                      allocate((allocator_type *)&local_120,1);
            *(uint *)(p_Var12->_M_storage)._M_storage = *(uint *)b;
            std::_Rb_tree_insert_and_rebalance
                      (bVar11,(_Rb_tree_node_base *)p_Var12,(_Rb_tree_node_base *)p_Var21,
                       (_Rb_tree_node_base *)&local_120._M_impl.super__Rb_tree_header);
            local_120._M_impl.super__Rb_tree_header._M_node_count =
                 local_120._M_impl.super__Rb_tree_header._M_node_count + 1;
          }
        }
        if (local_120._M_impl.super__Rb_tree_header._M_node_count == local_178) {
          while (poVar20 != poVar18) {
            uVar16 = *(ulong *)((long)&(poVar20->
                                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                       )._M_payload.
                                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                       ._M_payload + 0x28);
            if (local_178 < uVar16) {
              p_Var21 = *(_Base_ptr *)
                         ((long)&(poVar20->
                                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 0x10);
              if (local_120._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
                if (p_Var21 != (_Base_ptr)0x0) {
                  std::_Rb_tree_header::_M_move_data
                            (&local_120._M_impl.super__Rb_tree_header,
                             (_Rb_tree_header *)
                             ((long)&(poVar20->
                                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                     ._M_payload._M_value._M_t._M_impl + 8));
                }
              }
              else if (p_Var21 == (_Base_ptr)0x0) {
                *(_Rb_tree_color *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload + 8) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_color;
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x10) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_parent;
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x18) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload + 0x20) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_120._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     (_Base_ptr)
                     ((long)&(poVar20->
                             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                             ._M_payload + 8);
                *(ulong *)((long)&(poVar20->
                                  super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                  ._M_payload + 0x28) = local_178;
                local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_120._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_120._M_impl.super__Rb_tree_header._M_header;
                local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_120._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              else {
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x10) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var6 = *(_Base_ptr *)
                          ((long)&(poVar20->
                                  super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                  ._M_payload._M_value._M_t._M_impl + 0x18);
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x18) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var7 = *(_Base_ptr *)
                          ((long)&(poVar20->
                                  super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                  ._M_payload._M_value._M_t._M_impl + 0x20);
                *(_Base_ptr *)
                 ((long)&(poVar20->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload + 0x20) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_right;
                p_Var21->_M_parent = &local_120._M_impl.super__Rb_tree_header._M_header;
                (*(_Base_ptr *)
                  ((long)&(poVar20->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload._M_value._M_t._M_impl + 0x10))->_M_parent =
                     (_Base_ptr)
                     ((long)&(poVar20->
                             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                             ._M_payload + 8);
                *(ulong *)((long)&(poVar20->
                                  super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                  ._M_payload + 0x28) = local_178;
                local_120._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var21;
                local_120._M_impl.super__Rb_tree_header._M_header._M_left = p_Var6;
                local_120._M_impl.super__Rb_tree_header._M_header._M_right = p_Var7;
                local_120._M_impl.super__Rb_tree_header._M_node_count = uVar16;
              }
              CVar8.ctx_ptr =
                   *(TapSatisfier **)
                    &(poVar20->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_payload._M_value._M_t._M_impl;
              *(Comp *)&(poVar20->
                        super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                        ._M_payload._M_value._M_t._M_impl =
                   local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
              local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
                   (Comp)(Comp)CVar8.ctx_ptr;
            }
            local_178 = local_178 + uVar16;
            p_Var2 = (_Rb_tree_node_base *)
                     ((long)&(poVar20->
                             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                             ._M_payload._M_value._M_t._M_impl + 8);
            p_Var13 = *(_Rb_tree_node_base **)
                       ((long)&(poVar20->
                               super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                               ._M_payload + 0x18);
            while (p_Var14 = p_Var13, p_Var14 != p_Var2) {
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              pVar25 = std::
                       _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                       ::_M_get_insert_unique_pos(&local_120,&p_Var14[1]._M_color);
              p_Var22 = pVar25.second;
              if (p_Var22 != (_Rb_tree_node_base *)0x0) {
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_rebalance_for_erase(p_Var14,p_Var2);
                psVar1 = (size_t *)
                         ((long)&(poVar20->
                                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 0x28);
                *psVar1 = *psVar1 - 1;
                bVar10 = true;
                if (&local_120._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var22 &&
                    pVar25.first == (_Rb_tree_node_base *)0x0) {
                  bVar10 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                     ((Comp *)&local_120,&p_Var14[1]._M_color,&p_Var22[1]._M_color);
                }
                std::_Rb_tree_insert_and_rebalance
                          (bVar10,p_Var14,(_Rb_tree_node_base *)p_Var22,
                           (_Rb_tree_node_base *)&local_120._M_impl.super__Rb_tree_header);
                local_120._M_impl.super__Rb_tree_header._M_node_count =
                     local_120._M_impl.super__Rb_tree_header._M_node_count + 1;
              }
            }
            poVar20 = poVar20 + 1;
            if (local_120._M_impl.super__Rb_tree_header._M_node_count != local_178)
            goto LAB_00acbed8;
          }
          (pNVar3->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
          std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>::set
                    ((set<unsigned_int,_Comp,_std::allocator<unsigned_int>_> *)&local_b8,
                     (set<unsigned_int,_Comp,_std::allocator<unsigned_int>_> *)&local_120);
          local_b8._M_payload.
          super__Optional_payload<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
          ._M_payload._M_value.
          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
          ._M_engaged = true;
        }
        else {
LAB_00acbed8:
          (pNVar3->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          local_b8._M_payload.
          super__Optional_payload<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
          ._M_payload._M_value.
          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
          ._M_engaged = false;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_120);
        goto LAB_00acbf18;
      }
      goto LAB_00acbbc9;
    }
    stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
    _M_finish[-1].expanded = uVar16 + 1;
    local_78._0_4_ = 0;
    std::
    vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
    ::
    emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
              ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
                *)&stack,*(Node<unsigned_int> **)((bool *)(uVar16 * 0x10) + (long)psVar4),
               (int *)&local_78,(bool *)(uVar16 * 0x10));
  }
  if ((long)poVar18 -
      (long)results.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x38) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:679:13)]"
                 );
  }
  std::optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>::
  optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true>
            ((optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
              *)&local_b8,
             results.
             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
LAB_00acc0a2:
  std::
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ::~vector(&results);
  std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack);
  std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>::optional
            ((optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *)&local_f0,
             (optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *)&local_b8);
  std::
  _Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
  ::~_Optional_base(&local_b8);
  std::_Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>::
  _M_reset(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00acc1e9:
  __stack_chk_fail();
code_r0x00acbbb6:
  p_Var9 = &poVar17->
            super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
  ;
  poVar17 = poVar17 + 1;
  if ((p_Var9->_M_payload).
      super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
      .super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>.
      _M_engaged == false) goto code_r0x00acbbc0;
  goto LAB_00acbbb1;
code_r0x00acbbc0:
  (pNVar3->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
LAB_00acbbc9:
  local_b8._M_payload.
  super__Optional_payload<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
  ._M_payload._M_value.
  super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
  .super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>.
  _M_engaged = false;
LAB_00acbf18:
  std::optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>::
  optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true>
            ((optional<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
              *)&local_78._M_value,
             (optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *)&local_b8);
  std::_Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>::
  _M_reset((_Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_> *)
           &local_b8);
  if (local_40 != '\x01') {
    local_b8._M_payload.
    super__Optional_payload<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>
    ._M_engaged = false;
    std::
    _Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
    ::~_Optional_base((_Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
                       *)&local_78._M_value);
    goto LAB_00acc0a2;
  }
  lVar15 = (long)(pNVar3->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pNVar3->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar15 * -0x38 != 0) {
    __first_00 = results.
                 super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -lVar15;
    std::
    _Destroy<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>*,std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>>
              (__first_00,
               results.
               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,extraout_RDX);
    results.
    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first_00;
  }
  __last = results.
           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = results.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (results.
      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      results.
      super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if ((long)results.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)results.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar19 = std::__throw_length_error("vector::_M_realloc_insert");
        std::
        _Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
        ::~_Optional_base((_Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
                           *)&local_78._M_value);
        std::
        vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ::~vector(&results);
        std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar19);
        }
      }
      goto LAB_00acc1e9;
    }
    uVar24 = ((long)results.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)results.
                   super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    uVar16 = uVar24;
    if (results.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        results.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 1;
    }
    uVar23 = uVar16 + uVar24;
    __alloc = (_Tp_alloc_type *)0x249249249249249;
    if (0x249249249249248 < uVar23) {
      uVar23 = 0x249249249249249;
    }
    if (CARRY8(uVar16,uVar24)) {
      uVar23 = 0x249249249249249;
    }
    if (uVar23 == 0) {
      poVar17 = (pointer)0x0;
    }
    else {
      poVar17 = (pointer)operator_new(uVar23 * 0x38);
    }
    std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>::optional
              (poVar17 + uVar24,&local_78._M_value);
    poVar18 = std::
              vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ::_S_relocate(__first,__last,poVar17,__alloc);
    poVar18 = std::
              vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ::_S_relocate(__last,__last,poVar18 + 1,__alloc);
    std::
    _Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ::_M_deallocate((_Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                     *)__first,
                    (pointer)(((long)results.
                                     super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first) / 0x38),
                    ((long)results.
                           super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first) %
                    0x38);
    results.
    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar17 + uVar23;
    results.
    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = poVar17;
  }
  else {
    std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>::optional
              (results.
               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_78._M_value);
    poVar18 = __last + 1;
  }
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  results.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar18;
  std::
  _Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
  ::~_Optional_base((_Optional_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_false,_false>
                     *)&local_78._M_value);
  goto LAB_00acbb1b;
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }